

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

Oop __thiscall Lodtalk::ASTInterpreter::visitSequenceNode(ASTInterpreter *this,SequenceNode *node)

{
  pointer ppNVar1;
  bool bVar2;
  LocalDeclarations *pLVar3;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *pvVar4;
  Node **child;
  pointer ppNVar5;
  
  pLVar3 = AST::SequenceNode::getLocalDeclarations(node);
  if (pLVar3 == (LocalDeclarations *)0x0) {
    pvVar4 = AST::SequenceNode::getChildren(node);
    ppNVar1 = (pvVar4->
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    bVar2 = true;
    for (ppNVar5 = (pvVar4->
                   super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>).
                   _M_impl.super__Vector_impl_data._M_start; ppNVar5 != ppNVar1;
        ppNVar5 = ppNVar5 + 1) {
      if (!bVar2) {
        (*this->interpreter->_vptr_InterpreterProxy[6])();
      }
      (*(*ppNVar5)->_vptr_Node[2])(*ppNVar5,this);
      bVar2 = false;
    }
    return (Oop)&NilObject;
  }
  __assert_fail("0 && \"unimplemented\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Compiler.cpp"
                ,0x23b,"virtual Oop Lodtalk::ASTInterpreter::visitSequenceNode(SequenceNode *)");
}

Assistant:

Oop ASTInterpreter::visitSequenceNode(SequenceNode *node)
{
	if(node->getLocalDeclarations())
	{
		// TODO: Create the new scope
		assert(0 && "unimplemented");
		abort();
	}

    bool first = true;
	for(auto &child : node->getChildren())
    {
        if(first)
            first = false;
        else
            interpreter->popOop();
		child->acceptVisitor(this);
    }

	return Oop();
}